

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ParseTypeUrl
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          string *type_name)

{
  bool bVar1;
  stringpiece_ssize_type sVar2;
  Status *pSVar3;
  AlphaNum *in_R9;
  StringPiece error_message;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_40;
  Status *local_38;
  
  local_40 = type_name;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)type_url);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 &this->url_prefix_,"/");
  bVar1 = std::operator!=(&local_70,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    local_70._M_dataplus._M_p = "Invalid type URL, type URLs must be of the form \'";
    local_70._M_string_length = 0x31;
    local_c0.piece_data_ = (this->url_prefix_)._M_dataplus._M_p;
    local_c0.piece_size_ = (this->url_prefix_)._M_string_length;
    local_120.piece_data_ = "/<typename>\', got: ";
    local_120.piece_size_ = 0x13;
    local_f0.piece_data_ = (type_url->_M_dataplus)._M_p;
    local_f0.piece_size_ = type_url->_M_string_length;
    StrCat_abi_cxx11_(&local_90,(protobuf *)&local_70,&local_c0,&local_120,&local_f0,in_R9);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_90._M_string_length);
    pSVar3 = local_38;
    error_message.length_ = sVar2;
    error_message.ptr_ = local_90._M_dataplus._M_p;
    Status::Status(local_38,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)type_url);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pSVar3 = local_38;
    Status::Status(local_38);
  }
  return pSVar3;
}

Assistant:

Status ParseTypeUrl(const string& type_url, std::string* type_name) {
    if (type_url.substr(0, url_prefix_.size() + 1) != url_prefix_ + "/") {
      return Status(
          util::error::INVALID_ARGUMENT,
          StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = type_url.substr(url_prefix_.size() + 1);
    return Status();
  }